

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall TCPSocket::ConnectionClosed::ConnectionClosed(ConnectionClosed *this)

{
  allocator local_31;
  string local_30 [32];
  ConnectionClosed *local_10;
  ConnectionClosed *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Connection closed",&local_31);
  TCPSocketError::TCPSocketError(&this->super_TCPSocketError,(string *)local_30,0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *(undefined ***)&this->super_TCPSocketError = &PTR__ConnectionClosed_001498e8;
  return;
}

Assistant:

ConnectionClosed() : TCPSocketError("Connection closed"){}